

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeAnyValue
          (ParserImpl *this,Descriptor *value_descriptor,string *serialized_value)

{
  bool bVar1;
  uint uVar2;
  Message *pMVar3;
  pointer pMVar4;
  MessageLite *pMVar5;
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  string local_100;
  undefined1 local_e0 [8];
  string sub_delimiter;
  unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_> value;
  Message *value_prototype;
  DynamicMessageFactory factory;
  string *serialized_value_local;
  Descriptor *value_descriptor_local;
  ParserImpl *this_local;
  
  factory.prototypes_mutex_.mu_.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)serialized_value;
  DynamicMessageFactory::DynamicMessageFactory((DynamicMessageFactory *)&value_prototype);
  pMVar3 = DynamicMessageFactory::GetPrototype
                     ((DynamicMessageFactory *)&value_prototype,value_descriptor);
  if (pMVar3 == (Message *)0x0) {
    this_local._7_1_ = false;
    goto LAB_007262fc;
  }
  pMVar3 = Message::New(pMVar3);
  std::unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>>::
  unique_ptr<std::default_delete<google::protobuf::Message>,void>
            ((unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>> *
             )(sub_delimiter.field_2._M_local_buf + 8),pMVar3);
  std::__cxx11::string::string((string *)local_e0);
  bVar1 = ConsumeMessageDelimiter(this,(string *)local_e0);
  if (bVar1) {
    pMVar4 = std::
             unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
             ::get((unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                    *)((long)&sub_delimiter.field_2 + 8));
    std::__cxx11::string::string((string *)&local_100,(string *)local_e0);
    bVar1 = ConsumeMessage(this,pMVar4,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    if (bVar1) {
      if ((this->allow_partial_ & 1U) == 0) {
        pMVar4 = std::
                 unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                 ::operator->((unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                               *)((long)&sub_delimiter.field_2 + 8));
        uVar2 = (*(pMVar4->super_MessageLite)._vptr_MessageLite[5])();
        if ((uVar2 & 1) == 0) {
          __rhs = Descriptor::full_name_abi_cxx11_(value_descriptor);
          std::operator+(&local_140,"Value of type \"",__rhs);
          std::operator+(&local_120,&local_140,
                         "\" stored in google.protobuf.Any has missing required fields");
          ReportError(this,&local_120);
          std::__cxx11::string::~string((string *)&local_120);
          std::__cxx11::string::~string((string *)&local_140);
          this_local._7_1_ = false;
          goto LAB_007262c8;
        }
        pMVar5 = &std::
                  unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                  ::operator->((unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                                *)((long)&sub_delimiter.field_2 + 8))->super_MessageLite;
        MessageLite::AppendToString
                  (pMVar5,(string *)
                          factory.prototypes_mutex_.mu_.super___mutex_base._M_mutex.__data.__list.
                          __next);
      }
      else {
        pMVar5 = &std::
                  unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                  ::operator->((unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                                *)((long)&sub_delimiter.field_2 + 8))->super_MessageLite;
        MessageLite::AppendPartialToString
                  (pMVar5,(string *)
                          factory.prototypes_mutex_.mu_.super___mutex_base._M_mutex.__data.__list.
                          __next);
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
LAB_007262c8:
  std::__cxx11::string::~string((string *)local_e0);
  std::unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>::
  ~unique_ptr((unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
               *)((long)&sub_delimiter.field_2 + 8));
LAB_007262fc:
  DynamicMessageFactory::~DynamicMessageFactory((DynamicMessageFactory *)&value_prototype);
  return this_local._7_1_;
}

Assistant:

bool ConsumeAnyValue(const Descriptor* value_descriptor,
                       std::string* serialized_value) {
    DynamicMessageFactory factory;
    const Message* value_prototype = factory.GetPrototype(value_descriptor);
    if (value_prototype == nullptr) {
      return false;
    }
    std::unique_ptr<Message> value(value_prototype->New());
    std::string sub_delimiter;
    DO(ConsumeMessageDelimiter(&sub_delimiter));
    DO(ConsumeMessage(value.get(), sub_delimiter));

    if (allow_partial_) {
      value->AppendPartialToString(serialized_value);
    } else {
      if (!value->IsInitialized()) {
        ReportError(
            "Value of type \"" + value_descriptor->full_name() +
            "\" stored in google.protobuf.Any has missing required fields");
        return false;
      }
      value->AppendToString(serialized_value);
    }
    return true;
  }